

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3d3623::ArgParser::argPagesPositional(ArgParser *this,string *arg)

{
  vector<int,_std::allocator<int>_> local_30;
  
  if (this->called_pages_file == false) {
    QPDFJob::PagesConfig::file
              ((this->c_pages).super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,arg);
    this->called_pages_file = true;
  }
  else if (this->called_pages_range == true) {
    QPDFJob::PagesConfig::file
              ((this->c_pages).super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,arg);
    this->called_pages_range = false;
  }
  else {
    QUtil::parse_numrange(&local_30,(arg->_M_dataplus)._M_p,0);
    if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    QPDFJob::PagesConfig::range
              ((this->c_pages).super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,arg);
    this->called_pages_range = true;
  }
  return;
}

Assistant:

void
ArgParser::argPagesPositional(std::string const& arg)
{
    if (!called_pages_file) {
        c_pages->file(arg);
        called_pages_file = true;
        return;
    }
    if (called_pages_range) {
        c_pages->file(arg);
        called_pages_range = false;
        return;
    }
    // This could be a range or a file. Try parsing.
    try {
        QUtil::parse_numrange(arg.c_str(), 0);
        c_pages->range(arg);
        called_pages_range = true;
    } catch (std::runtime_error& e1) {
        // The range is invalid.  Let's see if it's a file.
        if (arg == ".") {
            // "." means the input file.
            QTC::TC("qpdf", "QPDFJob pages range omitted with .");
        } else if (QUtil::file_can_be_opened(arg.c_str())) {
            QTC::TC("qpdf", "QPDFJob pages range omitted in middle");
            // Yup, it's a file.
        } else {
            // Give the range error
            usage(e1.what());
        }
        c_pages->file(arg);
        called_pages_range = false;
    }
}